

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int PNode_equal(Parser *p,PNode *pn,D_Reduction *r,VecZNode *path,D_Shift *sh)

{
  uint uVar1;
  PNode *pPVar2;
  PNode *pPVar3;
  PNode *pPVar4;
  uint32 uVar5;
  PNode *_t_1;
  PNode *_t;
  PNode *y;
  PNode *x;
  uint n;
  uint i;
  D_Shift *sh_local;
  VecZNode *path_local;
  D_Reduction *r_local;
  PNode *pn_local;
  Parser *p_local;
  
  uVar1 = (pn->children).n;
  if (sh == (D_Shift *)0x0) {
    if (r == pn->reduction) {
      if ((path == (VecZNode *)0x0) && (uVar1 == 0)) {
        p_local._4_4_ = 1;
      }
      else if (uVar1 == path->n) {
        for (x._4_4_ = 0; x._4_4_ < uVar1; x._4_4_ = x._4_4_ + 1) {
          pPVar2 = (pn->children).v[x._4_4_];
          pPVar3 = path->v[(uVar1 - x._4_4_) - 1]->pn;
          while (pPVar2->latest != pPVar2->latest->latest) {
            pPVar4 = pPVar2->latest->latest;
            pPVar4->refcount = pPVar4->refcount + 1;
            uVar5 = pPVar2->latest->refcount - 1;
            pPVar2->latest->refcount = uVar5;
            if (uVar5 == 0) {
              free_PNode(p,pPVar2->latest);
            }
            pPVar2->latest = pPVar4;
          }
          pPVar2 = pPVar2->latest;
          while (pPVar3->latest != pPVar3->latest->latest) {
            pPVar4 = pPVar3->latest->latest;
            pPVar4->refcount = pPVar4->refcount + 1;
            uVar5 = pPVar3->latest->refcount - 1;
            pPVar3->latest->refcount = uVar5;
            if (uVar5 == 0) {
              free_PNode(p,pPVar3->latest);
            }
            pPVar3->latest = pPVar4;
          }
          if (pPVar2 != pPVar3->latest) {
            return 0;
          }
        }
        p_local._4_4_ = 1;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = (uint)(sh == pn->shift);
  }
  return p_local._4_4_;
}

Assistant:

static int PNode_equal(Parser *p, PNode *pn, D_Reduction *r, VecZNode *path, D_Shift *sh) {
  uint i, n = pn->children.n;
  if (sh) return sh == pn->shift;
  if (r != pn->reduction) return 0;
  if (!path && !n) return 1;
  if (n == path->n) {
    for (i = 0; i < n; i++) {
      PNode *x = pn->children.v[i], *y = path->v[n - i - 1]->pn;
      LATEST(p, x);
      LATEST(p, y);
      if (x != y) return 0;
    }
    return 1;
  }
  return 0;
}